

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_32x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [16];
  uint uVar28;
  uint8_t *puVar29;
  short sVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  ushort uVar33;
  ushort uVar34;
  short sVar35;
  ushort uVar36;
  ushort uVar37;
  short sVar38;
  ushort uVar39;
  ushort uVar40;
  short sVar41;
  ushort uVar42;
  ushort uVar43;
  short sVar44;
  ushort uVar45;
  ushort uVar46;
  short sVar47;
  ushort uVar48;
  ushort uVar49;
  short sVar50;
  ushort uVar51;
  ushort uVar52;
  short sVar53;
  ushort uVar54;
  ushort uVar55;
  short sVar56;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  undefined1 auVar57 [16];
  short sVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  
  auVar27 = _DAT_004687a0;
  auVar30 = pshuflw(ZEXT116(left_column[7]),ZEXT116(left_column[7]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar1._0_13_;
  auVar4[0xe] = auVar1[7];
  auVar6[0xc] = auVar1[6];
  auVar6._0_12_ = auVar1._0_12_;
  auVar6._13_2_ = auVar4._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar1._0_11_;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10[10] = auVar1[5];
  auVar10._0_10_ = auVar1._0_10_;
  auVar10._11_4_ = auVar8._11_4_;
  auVar12[9] = 0;
  auVar12._0_9_ = auVar1._0_9_;
  auVar12._10_5_ = auVar10._10_5_;
  auVar14[8] = auVar1[4];
  auVar14._0_8_ = auVar1._0_8_;
  auVar14._9_6_ = auVar12._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar14._8_7_;
  Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),auVar1[3]);
  auVar23._9_6_ = 0;
  auVar23._0_9_ = Var17;
  auVar18._1_10_ = SUB1510(auVar23 << 0x30,5);
  auVar18[0] = auVar1[2];
  auVar24._11_4_ = 0;
  auVar24._0_11_ = auVar18;
  auVar19._1_12_ = SUB1512(auVar24 << 0x20,3);
  auVar19[0] = auVar1[1];
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar2._0_13_;
  auVar3[0xe] = auVar2[7];
  auVar5[0xc] = auVar2[6];
  auVar5._0_12_ = auVar2._0_12_;
  auVar5._13_2_ = auVar3._13_2_;
  auVar7[0xb] = 0;
  auVar7._0_11_ = auVar2._0_11_;
  auVar7._12_3_ = auVar5._12_3_;
  auVar9[10] = auVar2[5];
  auVar9._0_10_ = auVar2._0_10_;
  auVar9._11_4_ = auVar7._11_4_;
  auVar11[9] = 0;
  auVar11._0_9_ = auVar2._0_9_;
  auVar11._10_5_ = auVar9._10_5_;
  auVar13[8] = auVar2[4];
  auVar13._0_8_ = auVar2._0_8_;
  auVar13._9_6_ = auVar11._9_6_;
  auVar20._7_8_ = 0;
  auVar20._0_7_ = auVar13._8_7_;
  Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),auVar2[3]);
  auVar25._9_6_ = 0;
  auVar25._0_9_ = Var21;
  auVar22._1_10_ = SUB1510(auVar25 << 0x30,5);
  auVar22[0] = auVar2[2];
  auVar26._11_4_ = 0;
  auVar26._0_11_ = auVar22;
  auVar15[2] = auVar2[1];
  auVar15._0_2_ = auVar2._0_2_;
  auVar15._3_12_ = SUB1512(auVar26 << 0x20,3);
  sVar31 = auVar30._2_2_;
  auVar30._2_2_ = sVar31 * 0x3b;
  auVar30._4_2_ = auVar30._0_2_ * 0x6e;
  auVar30._6_2_ = sVar31 * 0x97;
  auVar30._8_2_ = auVar30._0_2_ * 0xb7;
  auVar30._10_2_ = sVar31 * 0xce;
  auVar30._12_2_ = auVar30._0_2_ * 0xdb;
  auVar30._14_2_ = sVar31 * 0xe0;
  puVar29 = dst + 0x10;
  for (uVar28 = 0x1000100; uVar28 < 0xf0e0f0f; uVar28 = uVar28 + 0x2020202) {
    auVar57._4_4_ = uVar28;
    auVar57._0_4_ = uVar28;
    auVar57._8_4_ = uVar28;
    auVar57._12_4_ = uVar28;
    auVar32 = pshufb(auVar27,auVar57);
    auVar57 = pshufb(auVar30,auVar57);
    sVar56 = auVar57._0_2_ + 0x80;
    sVar58 = auVar57._2_2_ + 0x80;
    sVar59 = auVar57._4_2_ + 0x80;
    sVar60 = auVar57._6_2_ + 0x80;
    sVar61 = auVar57._8_2_ + 0x80;
    sVar62 = auVar57._10_2_ + 0x80;
    sVar63 = auVar57._12_2_ + 0x80;
    sVar64 = auVar57._14_2_ + 0x80;
    sVar31 = auVar32._0_2_;
    sVar35 = auVar32._2_2_;
    sVar38 = auVar32._4_2_;
    sVar41 = auVar32._6_2_;
    sVar44 = auVar32._8_2_;
    sVar47 = auVar32._10_2_;
    sVar50 = auVar32._12_2_;
    sVar53 = auVar32._14_2_;
    uVar33 = sVar31 * (ushort)auVar1[0] + sVar56;
    uVar36 = sVar35 * auVar19._0_2_ + sVar58;
    uVar39 = sVar38 * auVar18._0_2_ + sVar59;
    uVar42 = sVar41 * (short)Var17 + sVar60;
    uVar45 = sVar44 * auVar14._8_2_ + sVar61;
    uVar48 = sVar47 * auVar10._10_2_ + sVar62;
    uVar51 = sVar50 * auVar6._12_2_ + sVar63;
    uVar54 = sVar53 * (auVar4._13_2_ >> 8) + sVar64;
    uVar34 = uVar33 >> 8;
    uVar37 = uVar36 >> 8;
    uVar40 = uVar39 >> 8;
    uVar43 = uVar42 >> 8;
    uVar46 = uVar45 >> 8;
    uVar49 = uVar48 >> 8;
    uVar52 = uVar51 >> 8;
    uVar55 = uVar54 >> 8;
    uVar65 = sVar31 * (ushort)auVar1[8] + sVar56;
    uVar67 = sVar35 * (ushort)auVar1[9] + sVar58;
    uVar69 = sVar38 * (ushort)auVar1[10] + sVar59;
    uVar71 = sVar41 * (ushort)auVar1[0xb] + sVar60;
    uVar73 = sVar44 * (ushort)auVar1[0xc] + sVar61;
    uVar75 = sVar47 * (ushort)auVar1[0xd] + sVar62;
    uVar77 = sVar50 * (ushort)auVar1[0xe] + sVar63;
    uVar79 = sVar53 * (ushort)auVar1[0xf] + sVar64;
    uVar66 = uVar65 >> 8;
    uVar68 = uVar67 >> 8;
    uVar70 = uVar69 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar80 = uVar79 >> 8;
    puVar29[-0x10] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    puVar29[-0xf] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
    puVar29[-0xe] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    puVar29[-0xd] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
    puVar29[-0xc] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
    puVar29[-0xb] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    puVar29[-10] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    puVar29[-9] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    puVar29[-8] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    puVar29[-7] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
    puVar29[-6] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    puVar29[-5] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    puVar29[-4] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    puVar29[-3] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar29[-2] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar29[-1] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    uVar65 = sVar31 * (auVar2._0_2_ & 0xff) + sVar56;
    uVar67 = sVar35 * auVar15._2_2_ + sVar58;
    uVar69 = sVar38 * auVar22._0_2_ + sVar59;
    uVar71 = sVar41 * (short)Var21 + sVar60;
    uVar73 = sVar44 * auVar13._8_2_ + sVar61;
    uVar75 = sVar47 * auVar9._10_2_ + sVar62;
    uVar77 = sVar50 * auVar5._12_2_ + sVar63;
    uVar79 = sVar53 * (auVar3._13_2_ >> 8) + sVar64;
    uVar66 = uVar65 >> 8;
    uVar68 = uVar67 >> 8;
    uVar70 = uVar69 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar80 = uVar79 >> 8;
    uVar33 = sVar31 * (ushort)auVar2[8] + sVar56;
    uVar36 = sVar35 * (ushort)auVar2[9] + sVar58;
    uVar39 = sVar38 * (ushort)auVar2[10] + sVar59;
    uVar42 = sVar41 * (ushort)auVar2[0xb] + sVar60;
    uVar45 = sVar44 * (ushort)auVar2[0xc] + sVar61;
    uVar48 = sVar47 * (ushort)auVar2[0xd] + sVar62;
    uVar51 = sVar50 * (ushort)auVar2[0xe] + sVar63;
    uVar54 = sVar53 * (ushort)auVar2[0xf] + sVar64;
    uVar34 = uVar33 >> 8;
    uVar37 = uVar36 >> 8;
    uVar40 = uVar39 >> 8;
    uVar43 = uVar42 >> 8;
    uVar46 = uVar45 >> 8;
    uVar49 = uVar48 >> 8;
    uVar52 = uVar51 >> 8;
    uVar55 = uVar54 >> 8;
    *puVar29 = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    puVar29[1] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
    puVar29[2] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    puVar29[3] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    puVar29[4] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    puVar29[5] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    puVar29[6] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    puVar29[7] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    puVar29[8] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
    puVar29[9] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
    puVar29[10] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    puVar29[0xb] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
    puVar29[0xc] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
    puVar29[0xd] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    puVar29[0xe] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    puVar29[0xf] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    puVar29 = puVar29 + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_32x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[7]);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  __m128i scale = _mm_set1_epi16(256);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}